

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint ucvector_reserve(ucvector *p,size_t allocsize)

{
  uchar *puVar1;
  size_t local_38;
  void *data;
  size_t newsize;
  size_t allocsize_local;
  ucvector *p_local;
  
  if (p->allocsize < allocsize) {
    local_38 = allocsize;
    if (allocsize <= p->allocsize * 2) {
      local_38 = allocsize * 3 >> 1;
    }
    puVar1 = (uchar *)lodepng_realloc(p->data,local_38);
    if (puVar1 == (uchar *)0x0) {
      return 0;
    }
    p->allocsize = local_38;
    p->data = puVar1;
  }
  return 1;
}

Assistant:

static unsigned ucvector_reserve(ucvector* p, size_t allocsize)
{
  if(allocsize > p->allocsize)
  {
    size_t newsize = (allocsize > p->allocsize * 2) ? allocsize : (allocsize * 3 / 2);
    void* data = lodepng_realloc(p->data, newsize);
    if(data)
    {
      p->allocsize = newsize;
      p->data = (unsigned char*)data;
    }
    else return 0; /*error: not enough memory*/
  }
  return 1;
}